

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

uint xmlRandom(void)

{
  uint uVar1;
  uint *s;
  
  s = xmlGetLocalRngState();
  uVar1 = xoroshiro64ss(s);
  return uVar1;
}

Assistant:

unsigned
xmlRandom(void) {
#ifdef LIBXML_THREAD_ENABLED
    return(xoroshiro64ss(xmlGetLocalRngState()));
#else
    return(xmlGlobalRandom());
#endif
}